

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullup_set_operation.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPullup::PullupSetOperation
          (FilterPullup *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  pointer pLVar3;
  LogicalFilter *pLVar4;
  reference this_00;
  LogicalSetOperation *setop;
  reference this_01;
  type expr;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  size_type __n;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_48;
  LogicalOperator *local_40;
  LogicalOperator *local_38;
  
  *(undefined2 *)
   &op[3].super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = 1;
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  if (pLVar3->type == LOGICAL_INTERSECT) {
    local_38 = (in_RDX->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PullupBothSide((FilterPullup *)&local_48,op);
    _Var2._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (LogicalOperator *)0x0;
    _Var1._M_head_impl =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
      if (local_48._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)&(((((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *
                         )&(local_48._M_head_impl)->_vptr_LogicalOperator)->_M_t).
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
    }
    local_48._M_head_impl = (LogicalOperator *)0x0;
    if (local_38 != (LogicalOperator *)0x0) {
      (*local_38->_vptr_LogicalOperator[1])();
    }
    local_38 = (LogicalOperator *)0x0;
  }
  else {
    local_40 = (in_RDX->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    PullupFromLeft((FilterPullup *)&local_48,op);
    _Var2._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (LogicalOperator *)0x0;
    _Var1._M_head_impl =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
      if (local_48._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)&(((((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *
                         )&(local_48._M_head_impl)->_vptr_LogicalOperator)->_M_t).
                       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                     super_BaseExpression).type)();
      }
    }
    local_48._M_head_impl = (LogicalOperator *)0x0;
    if (local_40 != (LogicalOperator *)0x0) {
      (*local_40->_vptr_LogicalOperator[1])();
    }
    local_40 = (LogicalOperator *)0x0;
  }
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  if (pLVar3->type == LOGICAL_FILTER) {
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    pLVar4 = LogicalOperator::Cast<duckdb::LogicalFilter>(pLVar3);
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(pLVar4->super_LogicalOperator).children,0);
    setop = (LogicalSetOperation *)
            unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(this_00);
    if ((pLVar4->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pLVar4->super_LogicalOperator).expressions.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&(pLVar4->super_LogicalOperator).expressions,__n);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_01);
        ReplaceFilterTableIndex(expr,setop);
        __n = __n + 1;
      } while (__n < (ulong)((long)(pLVar4->super_LogicalOperator).expressions.
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pLVar4->super_LogicalOperator).expressions.
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  (this->filters_expr_pullup).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(in_RDX->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (in_RDX->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPullup::PullupSetOperation(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_INTERSECT || op->type == LogicalOperatorType::LOGICAL_EXCEPT);
	can_add_column = false;
	can_pullup = true;
	if (op->type == LogicalOperatorType::LOGICAL_INTERSECT) {
		op = PullupBothSide(std::move(op));
	} else {
		// EXCEPT only pull ups from LHS
		op = PullupFromLeft(std::move(op));
	}
	if (op->type == LogicalOperatorType::LOGICAL_FILTER) {
		auto &filter = op->Cast<LogicalFilter>();
		auto &setop = filter.children[0]->Cast<LogicalSetOperation>();
		for (idx_t i = 0; i < filter.expressions.size(); ++i) {
			ReplaceFilterTableIndex(*filter.expressions[i], setop);
		}
	}
	return op;
}